

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::ImageSizeTestInstance::commandBeforeCompute
          (ImageSizeTestInstance *this,VkCommandBuffer cmdBuffer)

{
  VkImageSubresourceRange subresourceRange_00;
  deUint32 layerCount;
  DeviceInterface *pDVar1;
  Image *this_00;
  VkImage *pVVar2;
  undefined1 local_80 [8];
  VkImageMemoryBarrier barrierSetImageLayout;
  undefined4 uStack_30;
  VkImageSubresourceRange subresourceRange;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  ImageSizeTestInstance *this_local;
  
  pDVar1 = Context::getDeviceInterface((this->super_SizeTestInstance).super_TestInstance.m_context);
  layerCount = Texture::numLayers(&(this->super_SizeTestInstance).m_texture);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&barrierSetImageLayout.field_0x44,1,0,1,0,layerCount);
  this_00 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator->(&(this->m_image).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
  ;
  pVVar2 = image::Image::get(this_00);
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00.aspectMask = barrierSetImageLayout._68_4_;
  subresourceRange_00.baseMipLevel = uStack_30;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_80,0,0,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)pVVar2->m_internal,subresourceRange_00);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,1,0x800,0,0,0,0,0,1,local_80);
  return;
}

Assistant:

void ImageSizeTestInstance::commandBeforeCompute (const VkCommandBuffer cmdBuffer)
{
	const DeviceInterface& vk = m_context.getDeviceInterface();

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, m_texture.numLayers());
	const VkImageMemoryBarrier barrierSetImageLayout = makeImageMemoryBarrier(
		0u, 0u,
		VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
		m_image->get(), subresourceRange);

	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &barrierSetImageLayout);
}